

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc.h
# Opt level: O2

void * snmalloc::libc::memalign(size_t alignment,size_t size)

{
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *fl;
  anon_class_8_1_8991fb9c domesticate;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  BVar1;
  void *pvVar2;
  Alloc<void> AVar3;
  ulong uVar4;
  size_t size_00;
  undefined8 *in_FS_OFFSET;
  undefined8 uStack_8;
  
  uVar4 = alignment - 1;
  if ((alignment ^ uVar4) <= uVar4) {
    uStack_8 = 0x16;
    pvVar2 = set_error(0x16);
    return pvVar2;
  }
  domesticate.this =
       (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
       *in_FS_OFFSET;
  uVar4 = size - 1 | uVar4;
  if (uVar4 == 0xffffffffffffffff) {
    size_00 = -(ulong)(size != 0);
  }
  else {
    if (uVar4 < 0xe000) {
      uStack_8 = (ulong)(byte)(&sizeclass_lookup)[uVar4 >> 4];
      fl = ((domesticate.this)->super_FastFreeLists).small_fast_free_lists + uStack_8;
      if (((domesticate.this)->super_FastFreeLists).small_fast_free_lists[uStack_8].curr.
          unsafe_capptr !=
          (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
           *)0x0) {
        BVar1 = freelist::
                Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
                ::
                take<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_1_>
                          ((Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
                            *)fl,&freelist::Object::key_root,domesticate);
        return BVar1.unsafe_capptr;
      }
      if (((domesticate.this)->remote_alloc).list.front.unsafe_capptr._M_b._M_p ==
          ((domesticate.this)->remote_alloc).list.back.unsafe_capptr._M_b._M_p) {
        AVar3 = Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
                small_alloc<(snmalloc::ZeroMem)0,_snmalloc::CheckInitPthread>::
                anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&uStack_8 + 7),domesticate.this,
                           uStack_8,fl);
        return AVar3.unsafe_capptr;
      }
      AVar3 = Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
              handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*)_1_,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*>
                        ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                          *)domesticate.this,domesticate.this,uStack_8);
      return AVar3.unsafe_capptr;
    }
    size_00 = uVar4 + 1;
  }
  AVar3 = Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
          alloc_not_small<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(size_00,domesticate.this)
  ;
  return AVar3.unsafe_capptr;
}

Assistant:

inline void* memalign(size_t alignment, size_t size)
  {
    if (SNMALLOC_UNLIKELY(alignment == 0 || !bits::is_pow2(alignment)))
    {
      return set_error(EINVAL);
    }

    return alloc_aligned(alignment, size);
  }